

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O2

void IoTHubClient_LL_UploadToBlob_Destroy(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  long lStack_10;
  
  if (handle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                 ,"IoTHubClient_LL_UploadToBlob_Destroy",0x4b7,1,"unexpected NULL argument");
      return;
    }
    return;
  }
  if (handle->cred_type - IOTHUB_CREDENTIAL_TYPE_X509 < 2) {
    free((handle->credentials).x509_credentials.x509certificate);
    free((handle->credentials).x509_credentials.x509privatekey);
    free((handle->credentials).x509_credentials.x509privatekeyType);
    lStack_10 = 0x38;
  }
  else {
    if (handle->cred_type != IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN) goto LAB_001276b5;
    lStack_10 = 0x20;
  }
  free(*(void **)((long)&handle->deviceId + lStack_10));
LAB_001276b5:
  free(handle->hostname);
  free(handle->certificates);
  free((handle->http_proxy_options).host_address);
  free((handle->http_proxy_options).username);
  free((handle->http_proxy_options).password);
  free(handle->networkInterface);
  free(handle);
  return;
}

Assistant:

void IoTHubClient_LL_UploadToBlob_Destroy(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle)
{
    if (handle == NULL)
    {
        LogError("unexpected NULL argument");
    }
    else
    {
        IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* upload_data = (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA*)handle;

        if (upload_data->cred_type == IOTHUB_CREDENTIAL_TYPE_X509 || upload_data->cred_type == IOTHUB_CREDENTIAL_TYPE_X509_ECC)
        {
            free(upload_data->credentials.x509_credentials.x509certificate);
            free(upload_data->credentials.x509_credentials.x509privatekey);
            free(upload_data->credentials.x509_credentials.x509privatekeyType);
            free(upload_data->credentials.x509_credentials.engine);
        }
        else if (upload_data->cred_type == IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN)
        {
            free(upload_data->credentials.supplied_sas_token);
        }

        free((void*)upload_data->hostname);
        if (upload_data->certificates != NULL)
        {
            free(upload_data->certificates);
        }
        if (upload_data->http_proxy_options.host_address != NULL)
        {
            free((char *)upload_data->http_proxy_options.host_address);
        }
        if (upload_data->http_proxy_options.username != NULL)
        {
            free((char *)upload_data->http_proxy_options.username);
        }
        if (upload_data->http_proxy_options.password != NULL)
        {
            free((char *)upload_data->http_proxy_options.password);
        }
        if (upload_data->networkInterface != NULL)
        {
            free((char*)upload_data->networkInterface);
        }
        free(upload_data);
    }
}